

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::GridRenderCase::genFragmentSource_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  size_t sVar1;
  char *pcVar2;
  char *__s;
  ostringstream buf;
  undefined1 local_190 [376];
  
  pcVar2 = "vtx_color";
  if ((*(byte *)((long)this + 0x80) & 1) != 0) {
    pcVar2 = "tess_color";
  }
  __s = "geo_color";
  if (*(char *)((long)this + 0x81) == '\0') {
    __s = pcVar2;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"${GLSL_VERSION_DECL}\nin mediump vec4 ",0x25);
  sVar1 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,__s,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,";\nlayout(location = 0) out mediump vec4 o_color;\n",0x31);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "uniform highp ivec2 u_viewportPos;\nuniform highp ivec2 u_viewportSize;\nflat in highp float v_bbox_expansionSize;\nflat in highp vec3 v_bbox_clipMin;\nflat in highp vec3 v_bbox_clipMax;\n\nbool fragmentInsideTheBBox(in highp float depth)\n{\n\thighp vec4 wc = vec4(floor((v_bbox_clipMin.x * 0.5 + 0.5) * float(u_viewportSize.x) - v_bbox_expansionSize/2.0),\n\t                     floor((v_bbox_clipMin.y * 0.5 + 0.5) * float(u_viewportSize.y) - v_bbox_expansionSize/2.0),\n\t                     ceil((v_bbox_clipMax.x * 0.5 + 0.5) * float(u_viewportSize.x) + v_bbox_expansionSize/2.0),\n\t                     ceil((v_bbox_clipMax.y * 0.5 + 0.5) * float(u_viewportSize.y) + v_bbox_expansionSize/2.0));\n\tif (gl_FragCoord.x < float(u_viewportPos.x) + wc.x || gl_FragCoord.x > float(u_viewportPos.x) + wc.z ||\n\t    gl_FragCoord.y < float(u_viewportPos.y) + wc.y || gl_FragCoord.y > float(u_viewportPos.y) + wc.w)\n\t    return false;\n\tconst highp float dEpsilon = 0.001;\n\tif (depth*2.0-1.0 < v_bbox_clipMin.z - dEpsilon || depth*2.0-1.0 > v_bbox_clipMax.z + dEpsilon)\n\t    return false;\n\treturn true;\n}\n"
             ,0x43e);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"\nvoid main()\n{\n\tmediump vec4 baseColor = ",0x29);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,__s,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             ";\n\tmediump float blueChannel;\n\tif (fragmentInsideTheBBox(gl_FragCoord.z))\n\t\tblueChannel = 0.0;\n\telse\n\t\tblueChannel = 1.0;\n\to_color = vec4(baseColor.r, baseColor.g, blueChannel, baseColor.a);\n}\n"
             ,0xc1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string GridRenderCase::genFragmentSource (void) const
{
	const char* const	colorInputName = (m_hasGeometryStage) ? ("geo_color") : (m_hasTessellationStage) ? ("tess_color") : ("vtx_color");
	std::ostringstream	buf;

	buf <<	"${GLSL_VERSION_DECL}\n"
			"in mediump vec4 " << colorInputName << ";\n"
			"layout(location = 0) out mediump vec4 o_color;\n"
		<<	genShaderFunction(SHADER_FUNC_INSIDE_BBOX)
		<<	"\n"
			"void main()\n"
			"{\n"
			"	mediump vec4 baseColor = " << colorInputName << ";\n"
			"	mediump float blueChannel;\n"
			"	if (fragmentInsideTheBBox(gl_FragCoord.z))\n"
			"		blueChannel = 0.0;\n"
			"	else\n"
			"		blueChannel = 1.0;\n"
			"	o_color = vec4(baseColor.r, baseColor.g, blueChannel, baseColor.a);\n"
			"}\n";

	return buf.str();
}